

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool embree::operator==(vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                        *a,vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                           *b)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  Vec3fx *pVVar4;
  Vec3fx *pVVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint in_R9D;
  
  uVar3 = a->size_active;
  if (uVar3 != b->size_active) {
    return false;
  }
  if (uVar3 != 0) {
    pVVar4 = a->items;
    pVVar5 = b->items;
    auVar6._4_4_ = -(uint)((pVVar5->field_0).m128[1] != (pVVar4->field_0).m128[1]);
    auVar6._0_4_ = -(uint)((pVVar5->field_0).m128[0] != (pVVar4->field_0).m128[0]);
    auVar6._8_4_ = -(uint)((pVVar5->field_0).m128[2] != (pVVar4->field_0).m128[2]);
    auVar6._12_4_ = -(uint)((pVVar5->field_0).m128[3] != (pVVar4->field_0).m128[3]);
    uVar10 = movmskps((int)a,auVar6);
    if ((uVar10 & 7) == 0) {
      lVar9 = 0x10;
      uVar8 = 1;
      do {
        uVar11 = uVar8;
        if (uVar3 == uVar11) break;
        pfVar1 = (float *)((long)&pVVar5->field_0 + lVar9);
        pfVar2 = (float *)((long)&pVVar4->field_0 + lVar9);
        auVar7._4_4_ = -(uint)(pfVar1[1] != pfVar2[1]);
        auVar7._0_4_ = -(uint)(*pfVar1 != *pfVar2);
        auVar7._8_4_ = -(uint)(pfVar1[2] != pfVar2[2]);
        auVar7._12_4_ = -(uint)(pfVar1[3] != pfVar2[3]);
        in_R9D = movmskps(in_R9D,auVar7);
        lVar9 = lVar9 + 0x10;
        uVar8 = uVar11 + 1;
      } while ((in_R9D & 7) == 0);
      return uVar3 <= uVar11;
    }
  }
  return uVar3 == 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }